

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmUnaryOp(LlvmCompilationContext *ctx,ExprUnaryOp *node)

{
  LLVMBuilderRef pLVar1;
  bool bVar2;
  LLVMValueRef pLVar3;
  LLVMTypeRef pLVar4;
  LLVMValueRef pLVar5;
  TypeBase *pTVar6;
  LLVMValueRef rhs_2;
  LLVMValueRef rhs_1;
  LLVMValueRef rhs;
  LLVMValueRef ptr;
  LLVMValueRef result;
  LLVMValueRef value;
  ExprUnaryOp *node_local;
  LlvmCompilationContext *ctx_local;
  
  pLVar3 = CompileLlvm(ctx,node->value);
  ptr = (LLVMValueRef)0x0;
  switch(*(undefined4 *)&(node->super_ExprBase).field_0x2c) {
  case 0:
    break;
  case 1:
    ptr = pLVar3;
    break;
  case 2:
    bVar2 = ExpressionContext::IsIntegerType(ctx->ctx,node->value->type);
    if (bVar2) {
      ptr = LLVMBuildNeg(ctx->builder,pLVar3,"");
    }
    else {
      ptr = LLVMBuildFNeg(ctx->builder,pLVar3,"");
    }
    break;
  case 3:
    ptr = LLVMBuildNot(ctx->builder,pLVar3,"");
    break;
  case 4:
    if ((TypeStruct *)node->value->type == ctx->ctx->typeAutoRef) {
      pLVar3 = LLVMBuildExtractValue(ctx->builder,pLVar3,1,"ref_ptr");
      pLVar4 = CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
      pLVar5 = LLVMConstPointerNull(pLVar4);
      pLVar1 = ctx->builder;
      pLVar3 = LLVMBuildICmp(ctx->builder,LLVMIntEQ,pLVar3,pLVar5,"");
      pLVar4 = CompileLlvmType(ctx,ctx->ctx->typeInt);
      ptr = LLVMBuildZExt(pLVar1,pLVar3,pLVar4,"");
    }
    else {
      bVar2 = isType<TypeRef>(node->value->type);
      if (bVar2) {
        pTVar6 = GetStackType(ctx,node->value->type);
        pLVar4 = CompileLlvmType(ctx,pTVar6);
        pLVar5 = LLVMConstPointerNull(pLVar4);
        pLVar1 = ctx->builder;
        pLVar3 = LLVMBuildICmp(ctx->builder,LLVMIntEQ,pLVar3,pLVar5,"");
        pLVar4 = CompileLlvmType(ctx,ctx->ctx->typeInt);
        ptr = LLVMBuildZExt(pLVar1,pLVar3,pLVar4,"");
      }
      else {
        pTVar6 = GetStackType(ctx,node->value->type);
        pLVar4 = CompileLlvmType(ctx,pTVar6);
        pLVar5 = LLVMConstInt(pLVar4,0,true);
        pLVar1 = ctx->builder;
        pLVar3 = LLVMBuildICmp(ctx->builder,LLVMIntEQ,pLVar3,pLVar5,"");
        pLVar4 = CompileLlvmType(ctx,ctx->ctx->typeInt);
        ptr = LLVMBuildZExt(pLVar1,pLVar3,pLVar4,"");
      }
    }
  }
  if (ptr == (LLVMValueRef)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x458,"LLVMValueRef CompileLlvmUnaryOp(LlvmCompilationContext &, ExprUnaryOp *)")
    ;
  }
  pLVar3 = CheckType(ctx,&node->super_ExprBase,ptr);
  return pLVar3;
}

Assistant:

LLVMValueRef CompileLlvmUnaryOp(LlvmCompilationContext &ctx, ExprUnaryOp *node)
{
	LLVMValueRef value = CompileLlvm(ctx, node->value);

	LLVMValueRef result = NULL;

	switch(node->op)
	{
	case SYN_UNARY_OP_UNKNOWN:
		break;
	case SYN_UNARY_OP_PLUS:
		result = value;
		break;
	case SYN_UNARY_OP_NEGATE:
		if(ctx.ctx.IsIntegerType(node->value->type))
			result = LLVMBuildNeg(ctx.builder, value, "");
		else
			result = LLVMBuildFNeg(ctx.builder, value, "");
		break;
	case SYN_UNARY_OP_BIT_NOT:
		result = LLVMBuildNot(ctx.builder, value, "");
		break;
	case SYN_UNARY_OP_LOGICAL_NOT:
		if(node->value->type == ctx.ctx.typeAutoRef)
		{
			LLVMValueRef ptr = LLVMBuildExtractValue(ctx.builder, value, 1, "ref_ptr");

			LLVMValueRef rhs = LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr));

			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntEQ, ptr, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		}
		else if(isType<TypeRef>(node->value->type))
		{
			LLVMValueRef rhs = LLVMConstPointerNull(CompileLlvmType(ctx, GetStackType(ctx, node->value->type)));

			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntEQ, value, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		}
		else
		{
			LLVMValueRef rhs = LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->value->type)), 0, true);

			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntEQ, value, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		}
		break;
	}

	assert(result);

	return CheckType(ctx, node, result);
}